

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsLessThan(JsValueRef object1,JsValueRef object2,bool *result)

{
  anon_class_24_3_4a217f53 fn;
  JsErrorCode JVar1;
  bool **in_stack_ffffffffffffffc0;
  bool *local_20;
  bool *result_local;
  JsValueRef object2_local;
  JsValueRef object1_local;
  
  fn.object2 = &local_20;
  fn.object1 = &result_local;
  fn.result = in_stack_ffffffffffffffc0;
  local_20 = result;
  result_local = (bool *)object2;
  object2_local = object1;
  JVar1 = ContextAPIWrapper<false,JsLessThan::__0>(fn);
  return JVar1;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsLessThan(_In_ JsValueRef object1, _In_ JsValueRef object2, _Out_ bool *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTLessThan, object1, object2, false);

        VALIDATE_INCOMING_REFERENCE(object1, scriptContext);
        VALIDATE_INCOMING_REFERENCE(object2, scriptContext);
        PARAM_NOT_NULL(result);

        *result = Js::JavascriptOperators::Less((Js::Var)object1, (Js::Var)object2, scriptContext) != 0;

        return JsNoError;
    });
}